

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O2

BaseState<false> * __thiscall
DefaultState<false>::Ignore(DefaultState<false> *this,Context<false> *ctx,SizeType length)

{
  char cVar1;
  Ch *pCVar2;
  ulong uVar3;
  ostream *poVar4;
  stringstream *psVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  char *pcVar9;
  
  pCVar2 = ctx->stream->src_;
  uVar3 = (ulong)length;
  pcVar9 = pCVar2 + uVar3 + 2;
  if ((pcVar9 < ctx->stream_end) && (*pcVar9 == ':')) {
    iVar6 = 0;
    iVar7 = 0;
    bVar8 = false;
    pcVar9 = pCVar2 + uVar3 + 3;
    while (!bVar8) {
      cVar1 = *pcVar9;
      if (cVar1 == '\"') {
        do {
          bVar8 = false;
          while( true ) {
            while( true ) {
              if (bVar8) goto LAB_0019ff49;
              cVar1 = pcVar9[1];
              if (cVar1 != '\"') break;
              bVar8 = true;
              pcVar9 = pcVar9 + 1;
            }
            if (cVar1 == '\\') break;
            bVar8 = false;
            pcVar9 = pcVar9 + 1;
            if (cVar1 == '\0') goto LAB_0019ffc0;
          }
          pcVar9 = pcVar9 + 2;
        } while( true );
      }
      if (cVar1 == ',') {
        bVar8 = false;
        if (iVar6 == 0 && iVar7 == 0) {
LAB_0019ff59:
          bVar8 = true;
          iVar6 = 0;
          iVar7 = 0;
        }
      }
      else {
        if (cVar1 == '[') {
          iVar7 = iVar7 + 1;
        }
        else if (cVar1 == ']') {
          if (iVar6 == 0 && iVar7 == 0) goto LAB_0019ff59;
          iVar7 = iVar7 + -1;
        }
        else if (cVar1 == '{') {
          iVar6 = iVar6 + 1;
        }
        else if (cVar1 == '}') {
          if (iVar6 == 0 && iVar7 == 0) goto LAB_0019ff59;
          iVar6 = iVar6 + -1;
        }
        else if (cVar1 == '\0') goto LAB_0019ffc0;
LAB_0019ff49:
        bVar8 = false;
      }
      pcVar9 = pcVar9 + 1;
    }
    if (pCVar2 + uVar3 + 3 < ctx->stream_end) {
      pCVar2[uVar3 + 3] = '0';
      memset(pCVar2 + uVar3 + 4,0x20,(size_t)(pcVar9 + ~(ulong)(pCVar2 + uVar3 + 4)));
      return &(ctx->ignore_state).super_BaseState<false>;
    }
LAB_0019ffc0:
    psVar5 = Context<false>::error_abi_cxx11_(ctx);
    psVar5 = psVar5 + 0x10;
    pcVar9 = "Found EOF";
  }
  else {
    psVar5 = Context<false>::error_abi_cxx11_(ctx);
    poVar4 = std::operator<<((ostream *)(psVar5 + 0x10),"Expected \':\' found \'");
    psVar5 = (stringstream *)std::operator<<(poVar4,*pcVar9);
    pcVar9 = "\'";
  }
  std::operator<<((ostream *)psVar5,pcVar9);
  return (BaseState<false> *)0x0;
}

Assistant:

BaseState<audit>* Ignore(Context<audit>& ctx, rapidjson::SizeType length)
  {
    // fast ignore
    // skip key + \0 + "
    char* head = ctx.stream->src_ + length + 2;
    if (head >= ctx.stream_end || *head != ':')
    {
      ctx.error() << "Expected ':' found '" << *head << "'";
      return nullptr;
    }
    head++;

    // scan for ,}
    // support { { ... } }
    int depth = 0, sq_depth = 0;
    bool stop = false;
    while (!stop)
    {
      switch (*head)
      {
        case '\0':
          ctx.error() << "Found EOF";
          return nullptr;
        case '"':
        {
          // skip strings
          bool stopInner = false;
          while (!stopInner)
          {
            head++;
            switch (*head)
            {
              case '\0':
                ctx.error() << "Found EOF";
                return nullptr;
              case '\\':
                head++;
                break;
              case '"':
                stopInner = true;
                break;
            }
          }
          break;
        }
        case '{':
          depth++;
          break;
        case '}':
          if (depth == 0 && sq_depth == 0)
            stop = true;
          else
            depth--;
          break;
        case '[':
          sq_depth++;
          break;
        case ']':
          if (depth == 0 && sq_depth == 0)
            stop = true;
          else
            sq_depth--;
          break;
        case ',':
          if (depth == 0 && sq_depth == 0)
            stop = true;
          break;
      }
      head++;
    }

    // skip key + \0 + ":
    char* value = ctx.stream->src_ + length + 3;
    if (value >= ctx.stream_end)
    {
      ctx.error() << "Found EOF";
      return nullptr;
    }

    *value = '0';
    value++;
    memset(value, ' ', head - value - 1);

    return &ctx.ignore_state;
  }